

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O2

Aig_Man_t * Ssw_FramesWithConstraints(Aig_Man_t *p,int nFrames)

{
  uint __line;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  Aig_Obj_t *p1;
  int iVar4;
  int iVar5;
  char *__assertion;
  
  if (p->nRegs < 1) {
    __assertion = "Aig_ManRegNum(p) > 0";
    __line = 0x35;
  }
  else {
    if (p->nRegs < p->nObjs[2]) {
      p_00 = Aig_ManStart(p->vObjs->nSize * nFrames);
      for (iVar4 = 0; iVar4 < p->nRegs; iVar4 = iVar4 + 1) {
        pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar4);
        Aig_ObjSetCopy(pAVar1,(Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1));
      }
      iVar4 = 0;
      if (nFrames < 1) {
        nFrames = 0;
      }
      do {
        if (iVar4 == nFrames) {
          Aig_ManCleanup(p_00);
          return p_00;
        }
        Aig_ObjSetCopy(p->pConst1,p_00->pConst1);
        for (iVar5 = 0; iVar5 < p->nTruePis; iVar5 = iVar5 + 1) {
          pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar5);
          pAVar2 = Aig_ObjCreateCi(p_00);
          Aig_ObjSetCopy(pAVar1,pAVar2);
        }
        for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
          pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
          if ((pAVar1 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar1->field_0x18 & 7) - 7))
          {
            pAVar2 = Aig_ObjChild0Copy(pAVar1);
            if (((ulong)pAVar1 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                            ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
            }
            uVar3 = (ulong)pAVar1->pFanin1 & 0xfffffffffffffffe;
            if (uVar3 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)((ulong)((uint)pAVar1->pFanin1 & 1) ^ *(ulong *)(uVar3 + 0x28));
            }
            pAVar2 = Aig_And(p_00,pAVar2,p1);
            Aig_ObjSetCopy(pAVar1,pAVar2);
          }
        }
        for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
          pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar5);
          pAVar2 = Aig_ObjChild0Copy(pAVar1);
          Aig_ObjSetCopy(pAVar1,pAVar2);
        }
        for (iVar5 = 0; iVar5 < p->nTruePos; iVar5 = iVar5 + 1) {
          pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar5);
          if (p->nTruePos - p->nConstrs <= iVar5) {
            pAVar1 = Aig_ObjCopy(pAVar1);
            Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((ulong)pAVar1 ^ 1));
          }
        }
        for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
          pAVar1 = Saig_ManLi(p,iVar5);
          pAVar2 = Saig_ManLo(p,iVar5);
          pAVar1 = Aig_ObjCopy(pAVar1);
          Aig_ObjSetCopy(pAVar2,pAVar1);
        }
        iVar4 = iVar4 + 1;
      } while( true );
    }
    __assertion = "Aig_ManRegNum(p) < Aig_ManCiNum(p)";
    __line = 0x36;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                ,__line,"Aig_Man_t *Ssw_FramesWithConstraints(Aig_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Constructs initialized timeframes with constraints as POs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Ssw_FramesWithConstraints( Aig_Man_t * p, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
//    assert( Saig_ManConstrNum(p) > 0 );
    assert( Aig_ManRegNum(p) > 0 );
    assert( Aig_ManRegNum(p) < Aig_ManCiNum(p) );
    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p) * nFrames );
    // create latches for the first frame
    Saig_ManForEachLo( p, pObj, i )
        Aig_ObjSetCopy( pObj, Aig_ManConst0(pFrames) );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // map constants and PIs
        Aig_ObjSetCopy( Aig_ManConst1(p), Aig_ManConst1(pFrames) );
        Saig_ManForEachPi( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_ObjCreateCi(pFrames) );
        // add internal nodes of this frame
        Aig_ManForEachNode( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ) );
        // transfer to the primary output
        Aig_ManForEachCo( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_ObjChild0Copy(pObj) );
        // create constraint outputs
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                continue;
            Aig_ObjCreateCo( pFrames, Aig_Not( Aig_ObjCopy(pObj) ) );
        }
        // transfer latch inputs to the latch outputs
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Aig_ObjSetCopy( pObjLo, Aig_ObjCopy(pObjLi) );
    }
    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    return pFrames;
}